

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitFileLoacation_x_iutest_x_NullFilePath_Test::Body
          (iu_UnitFileLoacation_x_iutest_x_NullFilePath_Test *this)

{
  int in_ECX;
  int line;
  _Alloc_hider _Var1;
  AssertionResult iutest_ar;
  iuCodeMessage local_210;
  string local_1e0;
  string local_1c0;
  Fixed local_1a0;
  
  iutest::detail::FormatFileLocation_abi_cxx11_
            (&local_1c0,(detail *)0x0,(char *)0xffffffffffffffff,in_ECX);
  line = 0x1641b6;
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"unknown file\"",
             "::iutest::detail::FormatFileLocation(__null, -1)","unknown file",(char *)&local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    _Var1 = iutest_ar.m_message._M_dataplus;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x49,iutest_ar.m_message._M_dataplus._M_p);
    line = (int)_Var1._M_p;
    local_210._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_210,&local_1a0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::FormatCompilerIndependentFileLocation_abi_cxx11_
            (&local_1e0,(detail *)0x0,(char *)0xffffffffffffffff,line);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"unknown file\"",
             "::iutest::detail::FormatCompilerIndependentFileLocation(__null, -1)","unknown file",
             (char *)&local_1e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x4a,iutest_ar.m_message._M_dataplus._M_p);
    local_210._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_210,&local_1a0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitFileLoacation, NullFilePath)
{
    IUTEST_EXPECT_STREQ("unknown file", ::iutest::detail::FormatFileLocation(NULL, -1));
    IUTEST_EXPECT_STREQ("unknown file", ::iutest::detail::FormatCompilerIndependentFileLocation(NULL, -1));
}